

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  SNMP_ERROR_RESPONSE SVar2;
  SortableOIDType *this;
  int *piVar3;
  ssize_t sVar4;
  ulong uVar5;
  uint uVar6;
  char *__s;
  bool bVar7;
  int responseLength;
  allocator local_4a2;
  allocator local_4a1;
  int local_4a0;
  int len;
  char buf [29];
  sockaddr_in cliaddr;
  string local_468;
  sockaddr local_448;
  char buffer [1024];
  
  local_4a0 = socket(2,2,0);
  if (local_4a0 < 0) {
    __s = "socket creation failed";
  }
  else {
    local_448.sa_data[6] = '\0';
    local_448.sa_data[7] = '\0';
    local_448.sa_data[8] = '\0';
    local_448.sa_data[9] = '\0';
    local_448.sa_data[10] = '\0';
    local_448.sa_data[0xb] = '\0';
    local_448.sa_data[0xc] = '\0';
    local_448.sa_data[0xd] = '\0';
    cliaddr.sin_family = 0;
    cliaddr.sin_port = 0;
    cliaddr.sin_addr.s_addr = 0;
    cliaddr.sin_zero[0] = '\0';
    cliaddr.sin_zero[1] = '\0';
    cliaddr.sin_zero[2] = '\0';
    cliaddr.sin_zero[3] = '\0';
    cliaddr.sin_zero[4] = '\0';
    cliaddr.sin_zero[5] = '\0';
    cliaddr.sin_zero[6] = '\0';
    cliaddr.sin_zero[7] = '\0';
    local_448.sa_family = 2;
    local_448.sa_data[0] = '\0';
    local_448.sa_data[1] = -0x5f;
    local_448.sa_data[2] = '\0';
    local_448.sa_data[3] = '\0';
    local_448.sa_data[4] = '\0';
    local_448.sa_data[5] = '\0';
    iVar1 = bind(local_4a0,&local_448,0x10);
    if (-1 < iVar1) {
      len = 0x10;
      puts("creating objs");
      uVar5 = 29999;
      uVar6 = 29999;
      while (bVar7 = uVar6 != 0, uVar6 = uVar6 - 1, bVar7) {
        buf[0x10] = '\0';
        buf[0x11] = '\0';
        buf[0x12] = '\0';
        buf[0x13] = '\0';
        buf[0x14] = '\0';
        buf[0x15] = '\0';
        buf[0x16] = '\0';
        buf[0x17] = '\0';
        buf[0x18] = '\0';
        buf[0x19] = '\0';
        buf[0x1a] = '\0';
        buf[0x1b] = '\0';
        buf[0x1c] = '\0';
        buf[0] = '\0';
        buf[1] = '\0';
        buf[2] = '\0';
        buf[3] = '\0';
        buf[4] = '\0';
        buf[5] = '\0';
        buf[6] = '\0';
        buf[7] = '\0';
        buf[8] = '\0';
        buf[9] = '\0';
        buf[10] = '\0';
        buf[0xb] = '\0';
        buf[0xc] = '\0';
        buf[0xd] = '\0';
        buf[0xe] = '\0';
        buf[0xf] = '\0';
        sprintf(buf,"%s%d",".1.3.6.1.4.1.5.",uVar5);
        this = (SortableOIDType *)operator_new(0x68);
        std::__cxx11::string::string((string *)buffer,buf,(allocator *)&local_468);
        SortableOIDType::SortableOIDType(this,(string *)buffer);
        std::__cxx11::string::~string((string *)buffer);
        piVar3 = (int *)calloc(1,4);
        iVar1 = rand();
        *piVar3 = iVar1;
        buffer._0_8_ = operator_new(0x28);
        *(SortableOIDType **)(buffer._0_8_ + 8) = this;
        *(undefined4 *)(buffer._0_8_ + 0x10) = 2;
        *(undefined2 *)(buffer._0_8_ + 0x14) = 0;
        *(undefined ***)buffer._0_8_ = &PTR_buildTypeWithValue_00117a38;
        *(int **)(buffer._0_8_ + 0x18) = piVar3;
        *(undefined4 *)(buffer._0_8_ + 0x20) = 0;
        std::deque<ValueCallback*,std::allocator<ValueCallback*>>::emplace_back<ValueCallback*>
                  ((deque<ValueCallback*,std::allocator<ValueCallback*>> *)&callbacks,
                   (ValueCallback **)buffer);
        uVar5 = (ulong)uVar6;
      }
      puts("sorting");
      sort_handlers(&callbacks);
      puts("ready");
      iVar1 = local_4a0;
      do {
        do {
          sVar4 = recvfrom(iVar1,buffer,0x400,0x100,(sockaddr *)&cliaddr,(socklen_t *)&len);
          buffer[(int)sVar4] = '\0';
          responseLength = 0;
          std::__cxx11::string::string((string *)buf,"public",&local_4a1);
          std::__cxx11::string::string((string *)&local_468,"pub",&local_4a2);
          SVar2 = handlePacket((uint8_t *)buffer,(int)sVar4,&responseLength,0x400,&callbacks,
                               (string *)buf,&local_468,(informCB)0x0,(void *)0x0);
          std::__cxx11::string::~string((string *)&local_468);
          std::__cxx11::string::~string((string *)buf);
          printf("SNMP Packet : %d, len:%d\n",(ulong)(uint)SVar2,(ulong)(uint)responseLength);
          iVar1 = local_4a0;
        } while (SVar2 < SNMP_NO_ERROR);
        sendto(local_4a0,buffer,(long)responseLength,0,(sockaddr *)&cliaddr,len);
      } while( true );
    }
    __s = "bind failed";
  }
  perror(__s);
  exit(1);
}

Assistant:

int main() { 
    int sockfd; 
    char buffer[MAXLINE]; 
    struct sockaddr_in servaddr, cliaddr; 
      
    // Creating socket file descriptor 
    if ( (sockfd = socket(AF_INET, SOCK_DGRAM, 0)) < 0 ) { 
        perror("socket creation failed"); 
        exit(EXIT_FAILURE); 
    } 
      
    memset(&servaddr, 0, sizeof(servaddr)); 
    memset(&cliaddr, 0, sizeof(cliaddr)); 
      
    // Filling server information 
    servaddr.sin_family    = AF_INET; // IPv4 
    servaddr.sin_addr.s_addr = INADDR_ANY; 
    servaddr.sin_port = htons(PORT); 
      
    // Bind the socket with the server address 
    if ( bind(sockfd, (const struct sockaddr *)&servaddr,  
            sizeof(servaddr)) < 0 ) 
    { 
        perror("bind failed"); 
        exit(EXIT_FAILURE); 
    } 
      
    int len, n; 
  
    len = sizeof(cliaddr);  //len is value/resuslt 

    // IntegerCallback* intCallback = new IntegerCallback(new OIDType(".1.3.6.1.4.1.5.0"));
    // intCallback->value = &testingInt;
    // callbacks.push_back(intCallback);

    const char* prefix = ".1.3.6.1.4.1.5.";

    printf("creating objs\n");


    for(int i = 29999; i > 0; i--){
        char buf[29] = {0};
        sprintf(buf, "%s%d", prefix, i);
        auto* oid = new SortableOIDType(buf);

        int* testInt = (int*)calloc(1, sizeof(int));
        *testInt = rand();
        IntegerCallback* cb = new IntegerCallback(oid, testInt);
        callbacks.push_back(cb);
    }

    printf("sorting\n");

    sort_handlers(callbacks);

    printf("ready\n");

    while(true){
        n = recvfrom(sockfd, (char *)buffer, MAXLINE,  
                    MSG_WAITALL, ( struct sockaddr *) &cliaddr, 
                    (socklen_t*)&len); 
        buffer[n] = '\0'; 

        int responseLength = 0;

        SNMP_ERROR_RESPONSE response = handlePacket((uint8_t*)buffer, n, &responseLength, 1024, callbacks, "public", "pub");

        printf("SNMP Packet : %d, len:%d\n", response, responseLength); 
        if(response > 0){
            sendto(sockfd, (const char *)buffer, responseLength,  
            0, (const struct sockaddr *) &cliaddr, 
                len);
        }
        
    }
    return 0; 
}